

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall cmFindLibraryHelper::AddName(cmFindLibraryHelper *this,string *name)

{
  cmAlphaNum local_1a0;
  cmAlphaNum local_170;
  undefined1 local_140 [8];
  string regex;
  undefined1 local_110 [8];
  Name entry;
  string *name_local;
  cmFindLibraryHelper *this_local;
  
  entry.Regex._200_8_ = name;
  Name::Name((Name *)local_110);
  local_110[0] = HasValidSuffix(this,(string *)entry.Regex._200_8_);
  std::__cxx11::string::operator=((string *)&entry,(string *)entry.Regex._200_8_);
  cmAlphaNum::cmAlphaNum(&local_170,'^');
  cmAlphaNum::cmAlphaNum(&local_1a0,&this->PrefixRegexStr);
  cmStrCat<>((string *)local_140,&local_170,&local_1a0);
  RegexFromLiteral(this,(string *)local_140,(string *)entry.Regex._200_8_);
  std::__cxx11::string::operator+=((string *)local_140,(string *)&this->SuffixRegexStr);
  if ((this->OpenBSD & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)local_140,"(\\.[0-9]+\\.[0-9]+)?");
  }
  std::__cxx11::string::operator+=((string *)local_140,"$");
  cmsys::RegularExpression::compile
            ((RegularExpression *)((long)&entry.Raw.field_2 + 8),(string *)local_140);
  std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::push_back
            (&this->Names,(value_type *)local_110);
  std::__cxx11::string::~string((string *)local_140);
  Name::~Name((Name *)local_110);
  return;
}

Assistant:

void cmFindLibraryHelper::AddName(std::string const& name)
{
  Name entry;

  // Consider checking the raw name too.
  entry.TryRaw = this->HasValidSuffix(name);
  entry.Raw = name;

  // Build a regular expression to match library names.
  std::string regex = cmStrCat('^', this->PrefixRegexStr);
  this->RegexFromLiteral(regex, name);
  regex += this->SuffixRegexStr;
  if (this->OpenBSD) {
    regex += "(\\.[0-9]+\\.[0-9]+)?";
  }
  regex += "$";
  entry.Regex.compile(regex);
  this->Names.push_back(std::move(entry));
}